

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::UninterpretedOption_NamePart::MergePartialFromCodedStream
          (UninterpretedOption_NamePart *this,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  string *value;
  uint32 tag;
  uint32 temp;
  uint32 local_2c;
  
LAB_001f9b6f:
  do {
    while( true ) {
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar1 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar3 = tag & 7;
      if (tag >> 3 != 2) break;
      if (uVar3 != 0) goto LAB_001f9c05;
LAB_001f9c1f:
      bVar2 = io::CodedInputStream::ReadVarint32(input,&local_2c);
      if (!bVar2) {
        return false;
      }
      this->is_extension_ = local_2c != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      bVar2 = io::CodedInputStream::ExpectAtEnd(input);
      if (bVar2) {
        return true;
      }
    }
    if ((tag >> 3 == 1) && (uVar3 == 2)) {
      value = mutable_name_part_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(input,value);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->name_part_->_M_dataplus)._M_p,(int)this->name_part_->_M_string_length,PARSE)
      ;
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x10')) {
        input->buffer_ = puVar1 + 1;
        goto LAB_001f9c1f;
      }
      goto LAB_001f9b6f;
    }
LAB_001f9c05:
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption_NamePart::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // required string name_part = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name_part()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name_part().data(), this->name_part().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_is_extension;
        break;
      }

      // required bool is_extension = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_is_extension:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &is_extension_)));
          set_has_is_extension();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}